

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O2

int log_map_iterator_next(log_map_iterator iterator)

{
  ulong uVar1;
  log_map_bucket plVar2;
  size_t sVar3;
  
  if (iterator != (log_map_iterator)0x0) {
    plVar2 = iterator->next;
    uVar1 = (iterator->map->table).size;
    sVar3 = iterator->position;
    while (sVar3 < uVar1) {
      for (; plVar2 != (log_map_bucket_conflict)0x0; plVar2 = plVar2->next) {
        if ((plVar2->key != (char *)0x0) && (plVar2->value != (void *)0x0)) {
          iterator->bucket = plVar2;
          iterator->next = plVar2->next;
          return 0;
        }
      }
      sVar3 = sVar3 + 1;
      iterator->position = sVar3;
      plVar2 = (iterator->map->table).data + sVar3;
    }
    iterator->bucket = plVar2;
  }
  return 1;
}

Assistant:

int log_map_iterator_next(log_map_iterator iterator)
{
	if (iterator == NULL)
	{
		return 1;
	}

	iterator->bucket = iterator->next;

	while (iterator->position < iterator->map->table.size)
	{
		while (iterator->bucket != NULL)
		{
			if (iterator->bucket->key != NULL && iterator->bucket->value != NULL)
			{
				iterator->next = iterator->bucket->next;

				return 0;
			}

			iterator->bucket = iterator->bucket->next;
		}

		++iterator->position;

		iterator->bucket = &iterator->map->table.data[iterator->position];
	}

	return 1;
}